

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
handle_str_callback_url_decoded
          (_func_int_void_ptr_char_ptr_size_t *callback,char *str,size_t strLen,
          curi_settings *settings,void *userData)

{
  size_t outputCapacity;
  curi_status cVar1;
  int iVar2;
  char *output;
  size_t urlDecodedStrLen;
  size_t local_38;
  
  cVar1 = curi_status_success;
  if (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && strLen != 0) {
    outputCapacity = strLen + 1;
    output = (char *)(*settings->allocate)(userData,outputCapacity);
    cVar1 = curi_url_decode(str,strLen,output,outputCapacity,&local_38);
    if (cVar1 == curi_status_success) {
      iVar2 = (*callback)(userData,output,local_38);
      cVar1 = (curi_status)(iVar2 == 0);
    }
    (*settings->deallocate)(userData,output,outputCapacity);
  }
  return cVar1;
}

Assistant:

static curi_status handle_str_callback_url_decoded(int (*callback)(void* userData, const char* str, size_t strLen), const char* str, size_t strLen, const curi_settings* settings, void* userData)
{
    curi_status status = curi_status_success;

    if (strLen > 0 && callback)
    {
        size_t allocationSize = (strLen+1) * sizeof(char);
        size_t urlDecodedStrLen;
        char* urlDecodedStr = (char*)settings->allocate(userData, allocationSize);

        status = curi_url_decode(str,strLen,urlDecodedStr,strLen+1,&urlDecodedStrLen);

        if (status == curi_status_success)
            if (callback(userData,urlDecodedStr,urlDecodedStrLen) == 0)
                status =  curi_status_canceled;

        settings->deallocate(userData, urlDecodedStr, allocationSize);
    }

    return status;
}